

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rb_generator.cc
# Opt level: O2

void __thiscall t_rb_generator::generate_service_helpers(t_rb_generator *this,t_service *tservice)

{
  t_rb_ofstream *ptVar1;
  ostream *poVar2;
  pointer pptVar3;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  _Vector_base<t_function_*,_std::allocator<t_function_*>_> local_30;
  
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&local_30,&tservice->functions_)
  ;
  ptVar1 = t_rb_ofstream::indent(&this->f_service_);
  poVar2 = std::operator<<((ostream *)ptVar1,"# HELPER FUNCTIONS AND STRUCTURES");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  for (pptVar3 = local_30._M_impl.super__Vector_impl_data._M_start;
      pptVar3 != local_30._M_impl.super__Vector_impl_data._M_finish; pptVar3 = pptVar3 + 1) {
    generate_rb_struct(this,&this->f_service_,(*pptVar3)->arglist_,false);
    generate_rb_function_helpers(this,*pptVar3);
  }
  std::_Vector_base<t_function_*,_std::allocator<t_function_*>_>::~_Vector_base(&local_30);
  return;
}

Assistant:

void t_rb_generator::generate_service_helpers(t_service* tservice) {
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;

  f_service_.indent() << "# HELPER FUNCTIONS AND STRUCTURES" << endl << endl;

  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    t_struct* ts = (*f_iter)->get_arglist();
    generate_rb_struct(f_service_, ts);
    generate_rb_function_helpers(*f_iter);
  }
}